

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletdb.cpp
# Opt level: O3

bool __thiscall wallet::WalletBatch::WriteBestBlock(WalletBatch *this,CBlockLocator *locator)

{
  bool bVar1;
  long in_FS_OFFSET;
  CBlockLocator local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_38.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_38.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  WriteIC<std::__cxx11::string,CBlockLocator>
            (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  &DBKeys::BESTBLOCK_abi_cxx11_,&local_38,true);
  if (local_38.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_38.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_38.vHave.super__Vector_base<uint256,_std::allocator<uint256>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  bVar1 = WriteIC<std::__cxx11::string,CBlockLocator>
                    (this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &DBKeys::BESTBLOCK_NOMERKLE_abi_cxx11_,locator,true);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool WalletBatch::WriteBestBlock(const CBlockLocator& locator)
{
    WriteIC(DBKeys::BESTBLOCK, CBlockLocator()); // Write empty block locator so versions that require a merkle branch automatically rescan
    return WriteIC(DBKeys::BESTBLOCK_NOMERKLE, locator);
}